

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXExportNode.h
# Opt level: O0

void __thiscall
Assimp::FBX::Node::AddChild<std::vector<int,std::allocator<int>>>
          (Node *this,string *name,vector<int,_std::allocator<int>_> *more)

{
  vector<int,_std::allocator<int>_> local_a8;
  undefined1 local_90 [8];
  Node c;
  vector<int,_std::allocator<int>_> *more_local;
  string *name_local;
  Node *this_local;
  
  c.property_start = (size_t)more;
  Node((Node *)local_90,name);
  std::vector<int,_std::allocator<int>_>::vector(&local_a8,more);
  AddProperties<std::vector<int,std::allocator<int>>>((Node *)local_90,&local_a8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_a8);
  std::vector<Assimp::FBX::Node,_std::allocator<Assimp::FBX::Node>_>::push_back
            (&this->children,(value_type *)local_90);
  ~Node((Node *)local_90);
  return;
}

Assistant:

void AddChild(
        const std::string& name,
        More... more
    ) {
        FBX::Node c(name);
        c.AddProperties(more...);
        children.push_back(c);
    }